

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void run_container_grow(run_container_t *run,int32_t min,_Bool copy)

{
  uint uVar1;
  int iVar2;
  rle16_t *prVar3;
  rle16_t *prVar4;
  uint uVar5;
  rle16_t *oldruns;
  
  uVar1 = run->capacity;
  if (uVar1 == 0) {
    iVar2 = 0;
  }
  else if ((int)uVar1 < 0x40) {
    iVar2 = uVar1 * 2;
  }
  else {
    if ((int)uVar1 < 0x400) {
      uVar5 = uVar1 >> 1;
    }
    else {
      uVar5 = uVar1 >> 2;
    }
    iVar2 = uVar1 + uVar5;
  }
  if (min < iVar2) {
    min = iVar2;
  }
  run->capacity = min;
  prVar4 = run->runs;
  if (copy) {
    prVar3 = (rle16_t *)realloc(prVar4,(long)min << 2);
    run->runs = prVar3;
    if (prVar3 == (rle16_t *)0x0) {
      free(prVar4);
    }
  }
  else {
    if (prVar4 != (rle16_t *)0x0) {
      free(prVar4);
    }
    prVar4 = (rle16_t *)malloc((long)run->capacity << 2);
    run->runs = prVar4;
  }
  if (run->runs == (rle16_t *)0x0) {
    run_container_grow_cold_1();
  }
  if (run->runs != (rle16_t *)0x0) {
    return;
  }
  __assert_fail("run->runs != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                ,0x37bb,"void run_container_grow(run_container_t *, int32_t, _Bool)");
}

Assistant:

void run_container_grow(run_container_t *run, int32_t min, bool copy) {
    int32_t newCapacity =
        (run->capacity == 0)
            ? RUN_DEFAULT_INIT_SIZE
            : run->capacity < 64 ? run->capacity * 2
                                 : run->capacity < 1024 ? run->capacity * 3 / 2
                                                        : run->capacity * 5 / 4;
    if (newCapacity < min) newCapacity = min;
    run->capacity = newCapacity;
    assert(run->capacity >= min);
    if (copy) {
        rle16_t *oldruns = run->runs;
        run->runs =
            (rle16_t *)realloc(oldruns, run->capacity * sizeof(rle16_t));
        if (run->runs == NULL) free(oldruns);
    } else {
        // Jon Strabala reports that some tools complain otherwise
        if (run->runs != NULL) {
          free(run->runs);
        }
        run->runs = (rle16_t *)malloc(run->capacity * sizeof(rle16_t));
    }
    // handle the case where realloc fails
    if (run->runs == NULL) {
      fprintf(stderr, "could not allocate memory\n");
    }
    assert(run->runs != NULL);
}